

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSRational.hpp
# Opt level: O3

double __thiscall
gte::BSRational<gte::UIntegerFP32<50>>::Convert<unsigned_long,double>
          (BSRational<gte::UIntegerFP32<50>> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int32_t iVar6;
  ulong value;
  int iVar7;
  int iVar8;
  ulong uVar9;
  FloatType FVar10;
  BSNumber<gte::UIntegerFP32<50>_> result;
  BSNumber<gte::UIntegerFP32<50>_> two;
  BSNumber<gte::UIntegerFP32<50>_> one;
  BSNumber<gte::UIntegerFP32<50>_> local_548;
  BSNumber<gte::UIntegerFP32<50>_> local_468;
  BSNumber<gte::UIntegerFP32<50>_> local_390;
  BSNumber<gte::UIntegerFP32<50>_> local_2b8;
  BSNumber<gte::UIntegerFP32<50>_> local_1e0;
  BSNumber<gte::UIntegerFP32<50>_> local_108;
  
  iVar1 = *(int *)this;
  if (iVar1 != 0) {
    iVar7 = *(int *)(this + 4);
    local_548.mBiasedExponent = iVar7;
    local_548.mSign = iVar1;
    iVar8 = *(int *)(this + 8);
    local_548.mUInteger._0_8_ = *(undefined8 *)(this + 8);
    if ((long)*(int *)(this + 0xc) != 0) {
      memcpy(&local_548.mUInteger.mBits,this + 0x10,(long)*(int *)(this + 0xc) << 2);
    }
    iVar2 = *(int *)(this + 0xd8);
    iVar3 = *(int *)(this + 0xdc);
    iVar4 = *(int *)(this + 0xe0);
    local_390.mUInteger.mSize = *(int32_t *)(this + 0xe4);
    local_390.mUInteger.mNumBits = iVar4;
    if ((long)local_390.mUInteger.mSize != 0) {
      memcpy(&local_390.mUInteger.mBits,this + 0xe8,(long)local_390.mUInteger.mSize << 2);
    }
    local_390.mSign = 1;
    iVar7 = (iVar7 + iVar8) - (iVar3 + iVar4);
    local_548.mBiasedExponent = 1 - iVar8;
    local_548.mSign = 1;
    local_390.mBiasedExponent = 1 - iVar4;
    bVar5 = BSNumber<gte::UIntegerFP32<50>_>::LessThanIgnoreSign(&local_548,&local_390);
    if (bVar5) {
      local_548.mBiasedExponent = local_548.mBiasedExponent + 1;
      iVar7 = iVar7 + -1;
    }
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber(&local_108,1);
    BSNumber<gte::UIntegerFP32<50>_>::BSNumber(&local_2b8,2);
    uVar9 = 0x10000000000000;
    iVar8 = -0x35;
    value = 0;
    do {
      bVar5 = BSNumber<gte::UIntegerFP32<50>_>::LessThanIgnoreSign(&local_548,&local_390);
      if (bVar5) {
        BSNumber<gte::UIntegerFP32<50>_>::operator*(&local_468,&local_2b8,&local_548);
        local_548.mUInteger.mSize = local_468.mUInteger.mSize;
        local_548.mUInteger.mNumBits = local_468.mUInteger.mNumBits;
        local_548.mSign = local_468.mSign;
        local_548.mBiasedExponent = local_468.mBiasedExponent;
        if (local_468.mUInteger.mSize != 0) {
          memcpy(&local_548.mUInteger.mBits,&local_468.mUInteger.mBits,
                 (long)local_468.mUInteger.mSize << 2);
        }
      }
      else {
        BSNumber<gte::UIntegerFP32<50>_>::operator-(&local_1e0,&local_548,&local_390);
        BSNumber<gte::UIntegerFP32<50>_>::operator*(&local_468,&local_2b8,&local_1e0);
        local_548.mUInteger.mSize = local_468.mUInteger.mSize;
        local_548.mUInteger.mNumBits = local_468.mUInteger.mNumBits;
        local_548.mSign = local_468.mSign;
        local_548.mBiasedExponent = local_468.mBiasedExponent;
        if (local_468.mUInteger.mSize != 0) {
          memcpy(&local_548.mUInteger.mBits,&local_468.mUInteger.mBits,
                 (long)local_468.mUInteger.mSize << 2);
        }
        value = value | uVar9;
      }
      uVar9 = uVar9 >> 1;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
    BSNumber<gte::UIntegerFP32<50>_>::operator-(&local_468,&local_548,&local_390);
    if (local_468.mUInteger.mSize != 0) {
      memcpy(&local_548.mUInteger.mBits,&local_468.mUInteger.mBits,
             (long)local_468.mUInteger.mSize << 2);
    }
    if ((0 < local_468.mSign) || ((local_468.mSign == 0 && ((value & 1) != 0)))) {
      value = value + 1;
    }
    if (value != 0) {
      iVar6 = BitHacks::GetTrailingBit(value);
      BSNumber<gte::UIntegerFP32<50>_>::BSNumber(&local_468,value >> ((byte)iVar6 & 0x3f));
      local_468.mBiasedExponent = iVar7 + iVar6 + -0x34;
      FVar10 = BSNumber<gte::UIntegerFP32<50>>::
               ConvertTo<gte::IEEEBinary<double,unsigned_long,64,53>>
                         ((BSNumber<gte::UIntegerFP32<50>> *)&local_468);
      if (-1 < iVar2 * iVar1) {
        return FVar10;
      }
      return (double)((ulong)FVar10 ^ (ulong)DAT_00109040);
    }
  }
  return 0.0;
}

Assistant:

RealType Convert() const
        {
            if (mNumerator.mSign == 0)
            {
                return (RealType)0;
            }

            // The ratio is abstractly of the form (1.u*2^p)/(1.v*2^q).
            // Convert to the form (1.u/1.v)*2^{p-q}, if 1.u >= 1.v, or to the
            // form (2*(1.u)/1.v)*2*{p-q-1}) if 1.u < 1.v.  The final form
            // n/d must be in the interval [1,2).
            BSNumber<UIntegerType> n = mNumerator, d = mDenominator;
            int32_t sign = n.mSign * d.mSign;
            n.mSign = 1;
            d.mSign = 1;
            int32_t pmq = n.GetExponent() - d.GetExponent();
            n.mBiasedExponent = 1 - n.GetUInteger().GetNumBits();
            d.mBiasedExponent = 1 - d.GetUInteger().GetNumBits();
            if (BSNumber<UIntegerType>::LessThanIgnoreSign(n, d))
            {
                ++n.mBiasedExponent;
                --pmq;
            }

            // At this time, n/d = 1.c in [1,2).  Define the sequence of bits
            // w = 1c = w_{imax} w_{imax-1} ... w_0 w_{-1} w_{-2} ... where
            // imax = precision(RealType)-1 and w_{imax} = 1.

            // Compute 'precision' bits for w, the leading bit guaranteed to
            // be 1 and occurring at index (1 << (precision-1)).
            BSNumber<UIntegerType> one(1), two(2);
            int const imax = std::numeric_limits<RealType>::digits - 1;
            UIntType w = 0;
            UIntType mask = ((UIntType)1 << imax);
            for (int i = imax; i >= 0; --i, mask >>= 1)
            {
                if (BSNumber<UIntegerType>::LessThanIgnoreSign(n, d))
                {
                    n = two * n;
                }
                else
                {
                    n = two * (n - d);
                    w |= mask;
                }
            }

            // Apply the mode round-to-nearest-ties-to-even to decide whether
            // to round down or up.  We computed w = w_{imax} ... w_0.  The
            // remainder is n/d = w_{imax+1}.w_{imax+2}... in [0,2).  Compute
            // n'/d = (n-d)/d in [-1,1).  Round-to-nearest-ties-to-even mode
            // is the following, where we need only test the sign of n'.  A
            // remainder of "half" is the case n' = 0.
            //   Round down when n' < 0 or (n' = 0 and w_0 = 0):  use w
            //   Round up when n' > 0 or (n' = 0 and w_0 == 1):  use w+1
            n = n - d;
            if (n.mSign > 0 || (n.mSign == 0 && (w & 1) == 1))
            {
                ++w;
            }

            if (w > 0)
            {
                // Ensure that the low-order bit of w is 1, which is required
                // for the BSNumber integer part.
                int32_t trailing = BitHacks::GetTrailingBit(w);
                w >>= trailing;
                pmq += trailing;

                // Compute a BSNumber with integer part w and the appropriate
                // number of bits and exponents.
                BSNumber<UIntegerType> result(w);
                result.mBiasedExponent = pmq - imax;
                RealType converted = (RealType)result;
                if (sign < 0)
                {
                    converted = -converted;
                }
                return converted;
            }
            else
            {
                return (RealType)0;
            }
        }